

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O3

UBool icu_63::TimeZone::parseCustomID
                (UnicodeString *id,int32_t *sign,int32_t *hour,int32_t *min,int32_t *sec)

{
  short sVar1;
  int32_t iVar2;
  int8_t iVar3;
  NumberFormat *pNVar4;
  char16_t *pcVar5;
  _func_int **pp_Var6;
  uint uVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  char16_t *pcVar11;
  ParsePosition pos;
  UErrorCode success;
  UnicodeString idUppercase;
  Formattable n;
  ParsePosition local_180;
  UErrorCode local_16c;
  ulong local_168;
  UChar *local_160;
  UnicodeString local_150;
  undefined1 local_110 [224];
  
  UnicodeString::UnicodeString(&local_150,id);
  Locale::Locale((Locale *)local_110,"",(char *)0x0,(char *)0x0,(char *)0x0);
  UnicodeString::toUpper(&local_150,(Locale *)local_110);
  Locale::~Locale((Locale *)local_110);
  sVar1 = (id->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar9 = (id->fUnion).fFields.fLength;
  }
  else {
    iVar9 = (int)sVar1 >> 5;
  }
  if (iVar9 < 4) {
    bVar10 = false;
    goto LAB_001f89bb;
  }
  iVar3 = UnicodeString::doCompare(&local_150,0,3,L"GMT",0,3);
  local_160 = L"GMT";
  bVar10 = false;
  if (iVar3 != '\0') goto LAB_001f89bb;
  local_180.super_UObject._vptr_UObject = (_func_int **)&PTR__ParsePosition_003b53a0;
  local_180.index = 3;
  local_180.errorIndex = -1;
  *sign = 1;
  *hour = 0;
  *min = 0;
  *sec = 0;
  sVar1 = (id->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar7 = (id->fUnion).fFields.fLength;
  }
  else {
    uVar7 = (int)sVar1 >> 5;
  }
  if (3 < uVar7) {
    pcVar11 = (char16_t *)((long)&id->fUnion + 2);
    pcVar5 = pcVar11;
    if (((int)sVar1 & 2U) == 0) {
      pcVar5 = (id->fUnion).fFields.fArray;
    }
    if (pcVar5[3] == L'+') {
LAB_001f8700:
      local_180.index = 4;
      local_180.errorIndex = -1;
      local_16c = U_ZERO_ERROR;
      pNVar4 = NumberFormat::createInstance(&local_16c);
      if (local_16c < U_ILLEGAL_ARGUMENT_ERROR) {
        (*(pNVar4->super_Format).super_UObject._vptr_UObject[0x17])(pNVar4,1);
        iVar2 = local_180.index;
        Formattable::Formattable((Formattable *)local_110,-99999);
        (*(pNVar4->super_Format).super_UObject._vptr_UObject[0x14])(pNVar4,id,local_110,&local_180);
        if (local_180.index == iVar2) {
LAB_001f8776:
          pp_Var6 = (pNVar4->super_Format).super_UObject._vptr_UObject;
LAB_001f89a2:
          (*pp_Var6[1])(pNVar4);
          bVar10 = false;
        }
        else {
          *hour = local_110._8_4_;
          sVar1 = (id->fUnion).fStackFields.fLengthAndFlags;
          if (sVar1 < 0) {
            uVar7 = (id->fUnion).fFields.fLength;
          }
          else {
            uVar7 = (int)sVar1 >> 5;
          }
          iVar9 = local_180.index - iVar2;
          if ((int)uVar7 <= local_180.index) {
            if (iVar9 - 1U < 6) {
              if (iVar9 - 5U < 2) {
                *sec = (int)local_110._8_4_ % 100;
                *min = (*hour / 100) % 100;
                iVar9 = *hour;
                iVar8 = iVar9 / 10000 + (iVar9 >> 0x1f);
              }
              else {
                if (1 < iVar9 - 3U) goto LAB_001f890f;
                *min = (int)local_110._8_4_ % 100;
                iVar9 = *hour;
                iVar8 = iVar9 / 100 + (iVar9 >> 0x1f);
              }
              *hour = iVar8 - (iVar9 >> 0x1f);
              goto LAB_001f890f;
            }
LAB_001f899b:
            pp_Var6 = (pNVar4->super_Format).super_UObject._vptr_UObject;
            goto LAB_001f89a2;
          }
          if ((2 < iVar9) || (uVar7 <= (uint)local_180.index)) goto LAB_001f899b;
          pcVar5 = pcVar11;
          if (((int)sVar1 & 2U) == 0) {
            pcVar5 = (id->fUnion).fFields.fArray;
          }
          if (pcVar5[local_180.index] != L':') goto LAB_001f899b;
          local_168 = (ulong)(local_180.index + 1U);
          local_180.index = local_180.index + 1U;
          Formattable::setLong((Formattable *)local_110,-99999);
          (*(pNVar4->super_Format).super_UObject._vptr_UObject[0x14])
                    (pNVar4,id,local_110,&local_180);
          if (local_180.index - (int)local_168 != 2) goto LAB_001f899b;
          *min = local_110._8_4_;
          sVar1 = (id->fUnion).fStackFields.fLengthAndFlags;
          if (sVar1 < 0) {
            uVar7 = (id->fUnion).fFields.fLength;
          }
          else {
            uVar7 = (int)sVar1 >> 5;
          }
          if (local_180.index < (int)uVar7) {
            if ((uint)local_180.index < uVar7) {
              if (((int)sVar1 & 2U) == 0) {
                pcVar11 = (id->fUnion).fFields.fArray;
              }
              if (pcVar11[local_180.index] == L':') {
                iVar9 = local_180.index + 1;
                local_180.index = iVar9;
                Formattable::setLong((Formattable *)local_110,-99999);
                (*(pNVar4->super_Format).super_UObject._vptr_UObject[0x14])
                          (pNVar4,id,local_110,&local_180);
                sVar1 = (id->fUnion).fStackFields.fLengthAndFlags;
                if (sVar1 < 0) {
                  iVar8 = (id->fUnion).fFields.fLength;
                }
                else {
                  iVar8 = (int)sVar1 >> 5;
                }
                if ((local_180.index != iVar8) || (local_180.index - iVar9 != 2)) goto LAB_001f8776;
                *sec = local_110._8_4_;
                goto LAB_001f890f;
              }
            }
            goto LAB_001f899b;
          }
LAB_001f890f:
          (*(pNVar4->super_Format).super_UObject._vptr_UObject[1])(pNVar4);
          bVar10 = *sec < 0x3c && (*min < 0x3c && *hour < 0x18);
        }
        Formattable::~Formattable((Formattable *)local_110);
        goto LAB_001f89b1;
      }
    }
    else if (pcVar5[3] == L'-') {
      *sign = -1;
      goto LAB_001f8700;
    }
    bVar10 = false;
  }
LAB_001f89b1:
  ParsePosition::~ParsePosition(&local_180);
LAB_001f89bb:
  UnicodeString::~UnicodeString(&local_150);
  return bVar10;
}

Assistant:

UBool
TimeZone::parseCustomID(const UnicodeString& id, int32_t& sign,
                        int32_t& hour, int32_t& min, int32_t& sec) {
    static const int32_t         kParseFailed = -99999;

    NumberFormat* numberFormat = 0;
    UnicodeString idUppercase = id;
    idUppercase.toUpper("");

    if (id.length() > GMT_ID_LENGTH &&
        idUppercase.startsWith(GMT_ID, GMT_ID_LENGTH))
    {
        ParsePosition pos(GMT_ID_LENGTH);
        sign = 1;
        hour = 0;
        min = 0;
        sec = 0;

        if (id[pos.getIndex()] == MINUS /*'-'*/) {
            sign = -1;
        } else if (id[pos.getIndex()] != PLUS /*'+'*/) {
            return FALSE;
        }
        pos.setIndex(pos.getIndex() + 1);

        UErrorCode success = U_ZERO_ERROR;
        numberFormat = NumberFormat::createInstance(success);
        if(U_FAILURE(success)){
            return FALSE;
        }
        numberFormat->setParseIntegerOnly(TRUE);
        //numberFormat->setLenient(TRUE); // TODO: May need to set this, depends on latest timezone parsing

        // Look for either hh:mm, hhmm, or hh
        int32_t start = pos.getIndex();
        Formattable n(kParseFailed);
        numberFormat->parse(id, n, pos);
        if (pos.getIndex() == start) {
            delete numberFormat;
            return FALSE;
        }
        hour = n.getLong();

        if (pos.getIndex() < id.length()) {
            if (pos.getIndex() - start > 2
                || id[pos.getIndex()] != COLON) {
                delete numberFormat;
                return FALSE;
            }
            // hh:mm
            pos.setIndex(pos.getIndex() + 1);
            int32_t oldPos = pos.getIndex();
            n.setLong(kParseFailed);
            numberFormat->parse(id, n, pos);
            if ((pos.getIndex() - oldPos) != 2) {
                // must be 2 digits
                delete numberFormat;
                return FALSE;
            }
            min = n.getLong();
            if (pos.getIndex() < id.length()) {
                if (id[pos.getIndex()] != COLON) {
                    delete numberFormat;
                    return FALSE;
                }
                // [:ss]
                pos.setIndex(pos.getIndex() + 1);
                oldPos = pos.getIndex();
                n.setLong(kParseFailed);
                numberFormat->parse(id, n, pos);
                if (pos.getIndex() != id.length()
                        || (pos.getIndex() - oldPos) != 2) {
                    delete numberFormat;
                    return FALSE;
                }
                sec = n.getLong();
            }
        } else {
            // Supported formats are below -
            //
            // HHmmss
            // Hmmss
            // HHmm
            // Hmm
            // HH
            // H

            int32_t length = pos.getIndex() - start;
            if (length <= 0 || 6 < length) {
                // invalid length
                delete numberFormat;
                return FALSE;
            }
            switch (length) {
                case 1:
                case 2:
                    // already set to hour
                    break;
                case 3:
                case 4:
                    min = hour % 100;
                    hour /= 100;
                    break;
                case 5:
                case 6:
                    sec = hour % 100;
                    min = (hour/100) % 100;
                    hour /= 10000;
                    break;
            }
        }

        delete numberFormat;

        if (hour > kMAX_CUSTOM_HOUR || min > kMAX_CUSTOM_MIN || sec > kMAX_CUSTOM_SEC) {
            return FALSE;
        }
        return TRUE;
    }
    return FALSE;
}